

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void convert_32s_P2C2(OPJ_INT32 **pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length,OPJ_INT32 adjust)

{
  OPJ_INT32 *pOVar1;
  OPJ_INT32 *pOVar2;
  OPJ_SIZE_T OVar3;
  
  pOVar1 = *pSrc;
  pOVar2 = pSrc[1];
  for (OVar3 = 0; length != OVar3; OVar3 = OVar3 + 1) {
    pDst[OVar3 * 2] = pOVar1[OVar3] + adjust;
    pDst[OVar3 * 2 + 1] = pOVar2[OVar3] + adjust;
  }
  return;
}

Assistant:

static void convert_32s_P2C2(OPJ_INT32 const* const* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length, OPJ_INT32 adjust)
{
	OPJ_SIZE_T i;
	const OPJ_INT32* pSrc0 = pSrc[0];
	const OPJ_INT32* pSrc1 = pSrc[1];
	
	for (i = 0; i < length; i++) {
		pDst[2*i+0] = pSrc0[i] + adjust;
		pDst[2*i+1] = pSrc1[i] + adjust;
	}
}